

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

SigningResult __thiscall
wallet::CWallet::SignMessage(CWallet *this,string *message,PKHash *pkhash,string *str_sig)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  SigningResult SVar3;
  _Base_ptr p_Var4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  CScript script_pub_key;
  SignatureData sigdata;
  _Variadic_union<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  local_438;
  undefined1 local_3f0;
  direct_or_indirect local_3e8;
  uint local_3cc;
  SignatureData local_3c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c8.complete = false;
  local_3c8.witness = false;
  p_Var4 = &local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  memset(&local_3c8.scriptSig,0,0xb8);
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.tr_builder.super__Optional_base<TaprootBuilder,_false,_false>._M_payload.
  super__Optional_payload<TaprootBuilder,_true,_false,_false>.
  super__Optional_payload_base<TaprootBuilder>._M_engaged = false;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.taproot_key_path_sig.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_3c8.missing_witness_script.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  local_3c8.missing_redeem_script.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.missing_sigs.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.missing_pubkeys.super__Vector_base<CKeyID,_std::allocator<CKeyID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_438._16_4_ =
       *(undefined4 *)
        ((pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 0x10);
  local_438._0_8_ =
       *(undefined8 *)(pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems
  ;
  local_438._8_8_ =
       *(undefined8 *)
        ((pkhash->super_BaseHash<uint160>).m_hash.super_base_blob<160U>.m_data._M_elems + 8);
  local_3f0 = 2;
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var4;
  local_3c8.tr_spenddata.scripts._M_t._M_impl.super__Rb_tree_header._M_header._M_right = p_Var4;
  local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.signatures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.taproot_script_sigs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.taproot_misc_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.tap_pubkeys._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.sha256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.hash256_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.ripemd160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3c8.hash160_preimages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GetScriptForDestination
            ((CScript *)&local_3e8.indirect_contents,(CTxDestination *)&local_438._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&local_438._M_first);
  p_Var4 = (this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->m_spk_managers)._M_t._M_impl.super__Rb_tree_header;
  SVar3 = PRIVATE_KEY_NOT_AVAILABLE;
  if ((_Rb_tree_header *)p_Var4 != p_Var1) {
    do {
      cVar2 = (**(code **)(**(long **)(p_Var4 + 2) + 0xb0))
                        (*(long **)(p_Var4 + 2),&local_3e8,&local_3c8);
      if (cVar2 != '\0') {
        local_438._8_8_ = local_438._8_8_ & 0xffffffffffffff00;
        local_438._0_8_ = &this->cs_wallet;
        std::unique_lock<std::recursive_mutex>::lock
                  ((unique_lock<std::recursive_mutex> *)&local_438._M_first);
        SVar3 = (**(code **)(**(long **)(p_Var4 + 2) + 0xc0))
                          (*(long **)(p_Var4 + 2),message,pkhash,str_sig);
        std::unique_lock<std::recursive_mutex>::~unique_lock
                  ((unique_lock<std::recursive_mutex> *)&local_438._M_first);
        goto LAB_00c50017;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    SVar3 = PRIVATE_KEY_NOT_AVAILABLE;
  }
LAB_00c50017:
  if (0x1c < local_3cc) {
    free(local_3e8.indirect_contents.indirect);
    local_3e8.indirect_contents.indirect = (char *)0x0;
  }
  SignatureData::~SignatureData(&local_3c8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return SVar3;
}

Assistant:

SigningResult CWallet::SignMessage(const std::string& message, const PKHash& pkhash, std::string& str_sig) const
{
    SignatureData sigdata;
    CScript script_pub_key = GetScriptForDestination(pkhash);
    for (const auto& spk_man_pair : m_spk_managers) {
        if (spk_man_pair.second->CanProvide(script_pub_key, sigdata)) {
            LOCK(cs_wallet);  // DescriptorScriptPubKeyMan calls IsLocked which can lock cs_wallet in a deadlocking order
            return spk_man_pair.second->SignMessage(message, pkhash, str_sig);
        }
    }
    return SigningResult::PRIVATE_KEY_NOT_AVAILABLE;
}